

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_State_PDU::Decode
          (Minefield_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  EntityType local_80;
  ushort local_6a;
  undefined1 local_68 [6];
  KUINT16 j;
  byte local_56;
  undefined1 local_55;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Minefield_State_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x48) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::clear(&this->m_vPoints);
  std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::clear
            (&this->m_vMineTypes);
  Minefield_Header::Decode(&this->super_Minefield_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&(this->m_SeqNumUnion).m_ui16SeqNum);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8ForceID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumPerimPoints);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_MinefieldType).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16NumMineTypes);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_Loc).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_Ori).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_App).super_DataTypeBase);
  KDataStream::operator>>(pKVar2,&(this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16);
  for (local_56 = 0; local_56 < this->m_ui8NumPerimPoints; local_56 = local_56 + 1) {
    DATA_TYPE::PerimeterPointCoordinate::PerimeterPointCoordinate
              ((PerimeterPointCoordinate *)local_68,pKStack_18);
    std::
    vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
    ::push_back(&this->m_vPoints,(PerimeterPointCoordinate *)local_68);
    DATA_TYPE::PerimeterPointCoordinate::~PerimeterPointCoordinate
              ((PerimeterPointCoordinate *)local_68);
  }
  for (local_6a = 0; local_6a < this->m_ui16NumMineTypes; local_6a = local_6a + 1) {
    DATA_TYPE::EntityType::EntityType(&local_80,pKStack_18);
    std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::
    push_back(&this->m_vMineTypes,&local_80);
    DATA_TYPE::EntityType::~EntityType(&local_80);
  }
  return;
}

Assistant:

void Minefield_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();
    m_vMineTypes.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> m_SeqNumUnion.m_ui16SeqNum
           >> m_ui8ForceID
           >> m_ui8NumPerimPoints
           >> KDIS_STREAM m_MinefieldType
           >> m_ui16NumMineTypes
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_App
           >> m_ui16ProtocolModeUnion.m_ui16ProtocolMode16;

    for( KUINT8 i = 0; i < m_ui8NumPerimPoints; ++i )
    {
        m_vPoints.push_back( PerimeterPointCoordinate( stream ) );
    }

    for( KUINT16 j = 0; j < m_ui16NumMineTypes; ++j )
    {
        m_vMineTypes.push_back( EntityType( stream ) );
    }
}